

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

int __thiscall Sudoku::rKrok(Sudoku *this,int index)

{
  sudoku_policko sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  sudoku_policko *psVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  int cisla [9];
  Sudoku novy;
  int local_218 [11];
  Sudoku local_1ec;
  
  local_218[4] = 5;
  local_218[5] = 6;
  local_218[6] = 7;
  local_218[7] = 8;
  local_218[0] = 1;
  local_218[1] = 2;
  local_218[2] = 3;
  local_218[3] = 4;
  local_218[8] = 9;
  do {
    iVar2 = krok(this);
  } while (iVar2 != 0);
  uVar4 = 1;
  if ((this->s).doplnenych != 0x51) {
    psVar5 = (this->s).pole + index;
    do {
      iVar2 = index;
      sVar1 = *psVar5;
      psVar5 = psVar5 + 1;
      index = iVar2 + 1;
    } while (((uint)sVar1 & 0xf) != 0);
    uVar7 = 4;
    do {
      iVar3 = rand();
      lVar6 = (long)iVar3 % (long)((uVar7 >> 2) + 1);
      if (uVar7 != lVar6 * 4) {
        iVar3 = *(int *)((long)local_218 + uVar7);
        *(int *)((long)local_218 + uVar7) = local_218[lVar6];
        local_218[lVar6] = iVar3;
      }
      uVar7 = uVar7 + 4;
    } while (uVar7 != 0x24);
    bVar8 = true;
    uVar7 = 0;
    do {
      memcpy(&local_1ec,this,0x1bc);
      iVar3 = doplnK(&local_1ec,iVar2 % 9,iVar2 / 9,local_218[uVar7]);
      if ((iVar3 != 0) && (iVar3 = rKrok(&local_1ec,iVar2 + 1), iVar3 != 0)) {
        memcpy(this,&local_1ec,0x1bc);
        break;
      }
      bVar8 = uVar7 < 8;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 9);
    uVar4 = (uint)bVar8;
  }
  return uVar4;
}

Assistant:

int Sudoku::rKrok (int index)
{
  int vysledek;
  int cisla[] = {1, 2, 3, 4, 5, 6, 7, 8, 9}; // seznam cisel na vyzkouseni
  // funguje to tak, ze si udelame tento seznam a ten pak pokazde nahodne prehazime
  // pro nedostatecne specifikovane sudoku (majici vice reseni) to znamena, ze reseni jsou nahodna

  // projdeme doplnovaci metodu, pokud to jde, vratime kladny vysledek
  // tato motoda diky tomu jak je postavena odchyti nektere kriticke stavy jako pokusy o pristup mimo pridelenou pamet apod.
  if (jednoducheReseni()) // povedlo se...
  {
    return true;
  }
  // nepovedlo se :/
  // zkusime to nasilnejsi metodou... hadanim :)
  else // budeme pokracovat v rekurzi
  {
    while (s.pole[index].zapsane) index++; // hledame dalsi prazdne policko
    random_shuffle(cisla, cisla + 9);// prehazime seznam cisel k vyzkoseni - soucast <algorithm>
    for (int i = 0; i< 9;i++)// vyzkousime vsechny mozna cisla v seznamu
    {
      Sudoku novy(this); // zkopirujeme si stavajici sudoku
      
      if(novy.doplnK(index%9,index/9,cisla[i])) // zkusime cislo doplnit
      {
        // slo to
        if(novy.rKrok(index+1)) // prokud se podari doplnit i dalsi pozici, je vse OK
        {
          s = novy.s; // okopirujeme stav noveho sudoku do puvodniho (tohoto)
          return true; // vse OK
        }
      }
    }
  }
  return false; // rekurze nad neplatnym sudoku vede k chybam...
}